

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int __thiscall Server::hexCharToInt(Server *this,char input)

{
  char input_local;
  Server *this_local;
  
  if ((input < '0') || ('9' < input)) {
    if ((input < 'A') || ('F' < input)) {
      if ((input < 'a') || ('f' < input)) {
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = input + -0x57;
      }
    }
    else {
      this_local._4_4_ = input + -0x37;
    }
  }
  else {
    this_local._4_4_ = input + -0x30;
  }
  return this_local._4_4_;
}

Assistant:

int Server::hexCharToInt(char input) {
    if (input >= '0' && input <= '9') {
        return input - '0';
    } else if (input >= 'A' && input <= 'F') {
        return input - 'A' + 10;
    } else if (input >= 'a' && input <= 'f') {
        return input - 'a' + 10;
    } else {
        return -1;
    }
}